

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Matchers::Impl::Generic::
AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::toString
          (string *__return_storage_ptr__,
          AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  pointer pPVar1;
  long lVar2;
  ulong uVar3;
  ostringstream oss;
  char *local_1c8;
  long local_1c0;
  char local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"( ",2);
  pPVar1 = (this->m_matchers).
           super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_matchers).
      super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," and ",5);
        pPVar1 = (pointer)((long)&((this->m_matchers).
                                   super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar2);
      }
      (*(pPVar1->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
        _vptr_NonCopyable[6])(&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1c8,local_1c0);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      uVar3 = uVar3 + 1;
      pPVar1 = (this->m_matchers).
               super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 8;
    } while (uVar3 < (ulong)((long)(this->m_matchers).
                                   super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," )",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const {
                std::ostringstream oss;
                oss << "( ";
                for( std::size_t i = 0; i < m_matchers.size(); ++i ) {
                    if( i != 0 )
                        oss << " and ";
                    oss << m_matchers[i]->toString();
                }
                oss << " )";
                return oss.str();
            }